

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

DdNode * Ivy_FraigNodesAreEquivBdd_int(DdManager *dd,DdNode *bFunc,Vec_Ptr_t *vFront,int Level)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p;
  Ivy_Obj_t *pIVar3;
  DdNode **vector;
  Ivy_Obj_t *pIVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  void *pvVar7;
  int local_68;
  int local_54;
  int NewSize;
  int i;
  Ivy_Obj_t *pFanin;
  Ivy_Obj_t *pObj;
  Vec_Ptr_t *vTemp;
  DdNode *bFuncNew;
  DdNode **pFuncs;
  int Level_local;
  Vec_Ptr_t *vFront_local;
  DdNode *bFunc_local;
  DdManager *dd_local;
  
  p = Vec_PtrAlloc(100);
  for (local_54 = 0; iVar1 = Vec_PtrSize(vFront), local_54 < iVar1; local_54 = local_54 + 1) {
    pIVar3 = (Ivy_Obj_t *)Vec_PtrEntry(vFront,local_54);
    if (*(uint *)&pIVar3->field_0x8 >> 0xb == Level) {
      pIVar4 = Ivy_ObjFanin0(pIVar3);
      if ((*(uint *)&pIVar4->field_0x8 >> 5 & 1) == 0) {
        *(uint *)&pIVar4->field_0x8 = *(uint *)&pIVar4->field_0x8 & 0xffffffdf | 0x20;
        iVar1 = Vec_PtrSize(p);
        pIVar4->TravId = iVar1;
        Vec_PtrPush(p,pIVar4);
      }
      pIVar3 = Ivy_ObjFanin1(pIVar3);
      if ((*(uint *)&pIVar3->field_0x8 >> 5 & 1) == 0) {
        *(uint *)&pIVar3->field_0x8 = *(uint *)&pIVar3->field_0x8 & 0xffffffdf | 0x20;
        iVar1 = Vec_PtrSize(p);
        pIVar3->TravId = iVar1;
        Vec_PtrPush(p,pIVar3);
      }
    }
    else {
      *(uint *)&pIVar3->field_0x8 = *(uint *)&pIVar3->field_0x8 & 0xffffffdf | 0x20;
      iVar1 = Vec_PtrSize(p);
      pIVar3->TravId = iVar1;
      Vec_PtrPush(p,pIVar3);
    }
  }
  iVar1 = dd->size;
  iVar2 = Vec_PtrSize(p);
  if (iVar2 < iVar1) {
    local_68 = dd->size;
  }
  else {
    local_68 = Vec_PtrSize(p);
  }
  vector = (DdNode **)malloc((long)local_68 << 3);
  for (local_54 = 0; iVar1 = Vec_PtrSize(vFront), local_54 < iVar1; local_54 = local_54 + 1) {
    pIVar3 = (Ivy_Obj_t *)Vec_PtrEntry(vFront,local_54);
    if (*(uint *)&pIVar3->field_0x8 >> 0xb == Level) {
      pIVar4 = Ivy_ObjFanin0(pIVar3);
      pDVar6 = Cudd_bddIthVar(dd,pIVar4->TravId);
      iVar1 = Ivy_ObjFaninC0(pIVar3);
      pIVar4 = Ivy_ObjFanin1(pIVar3);
      pDVar5 = Cudd_bddIthVar(dd,pIVar4->TravId);
      iVar2 = Ivy_ObjFaninC1(pIVar3);
      pDVar6 = Cudd_bddAnd(dd,(DdNode *)((ulong)pDVar6 ^ (long)iVar1),
                           (DdNode *)((ulong)pDVar5 ^ (long)iVar2));
      vector[local_54] = pDVar6;
    }
    else {
      pDVar6 = Cudd_bddIthVar(dd,pIVar3->TravId);
      vector[local_54] = pDVar6;
    }
    Cudd_Ref(vector[local_54]);
  }
  if (local_68 == dd->size) {
    for (local_54 = Vec_PtrSize(vFront); local_54 < dd->size; local_54 = local_54 + 1) {
      pDVar6 = Cudd_bddIthVar(dd,local_54);
      vector[local_54] = pDVar6;
      Cudd_Ref(vector[local_54]);
    }
    pDVar6 = Cudd_bddVectorCompose(dd,bFunc,vector);
    Cudd_Ref(pDVar6);
    for (local_54 = 0; iVar1 = Vec_PtrSize(p), local_54 < iVar1; local_54 = local_54 + 1) {
      pvVar7 = Vec_PtrEntry(p,local_54);
      *(uint *)((long)pvVar7 + 8) = *(uint *)((long)pvVar7 + 8) & 0xffffffdf;
      *(undefined4 *)((long)pvVar7 + 4) = 0;
    }
    for (local_54 = 0; local_54 < dd->size; local_54 = local_54 + 1) {
      Cudd_RecursiveDeref(dd,vector[local_54]);
    }
    if (vector != (DdNode **)0x0) {
      free(vector);
    }
    if (vFront->pArray != (void **)0x0) {
      free(vFront->pArray);
      vFront->pArray = (void **)0x0;
    }
    iVar1 = p->nSize;
    vFront->nCap = p->nCap;
    vFront->nSize = iVar1;
    vFront->pArray = p->pArray;
    p->nSize = 0;
    p->nCap = 0;
    p->pArray = (void **)0x0;
    Vec_PtrFree(p);
    Cudd_Deref(pDVar6);
    return pDVar6;
  }
  __assert_fail("NewSize == dd->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                ,0xaaa,
                "DdNode *Ivy_FraigNodesAreEquivBdd_int(DdManager *, DdNode *, Vec_Ptr_t *, int)");
}

Assistant:

DdNode * Ivy_FraigNodesAreEquivBdd_int( DdManager * dd, DdNode * bFunc, Vec_Ptr_t * vFront, int Level )
{
    DdNode ** pFuncs;
    DdNode * bFuncNew;
    Vec_Ptr_t * vTemp;
    Ivy_Obj_t * pObj, * pFanin;
    int i, NewSize;
    // create new frontier
    vTemp = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pObj, i )
    {
        if ( (int)pObj->Level != Level )
        {
            pObj->fMarkB = 1;
            pObj->TravId = Vec_PtrSize(vTemp);
            Vec_PtrPush( vTemp, pObj );
            continue;
        }

        pFanin = Ivy_ObjFanin0(pObj);
        if ( pFanin->fMarkB == 0 )
        {
            pFanin->fMarkB = 1;
            pFanin->TravId = Vec_PtrSize(vTemp);
            Vec_PtrPush( vTemp, pFanin );
        }

        pFanin = Ivy_ObjFanin1(pObj);
        if ( pFanin->fMarkB == 0 )
        {
            pFanin->fMarkB = 1;
            pFanin->TravId = Vec_PtrSize(vTemp);
            Vec_PtrPush( vTemp, pFanin );
        }
    }
    // collect the permutation
    NewSize = IVY_MAX(dd->size, Vec_PtrSize(vTemp));
    pFuncs = ABC_ALLOC( DdNode *, NewSize );
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pObj, i )
    {
        if ( (int)pObj->Level != Level )
            pFuncs[i] = Cudd_bddIthVar( dd, pObj->TravId );
        else
            pFuncs[i] = Cudd_bddAnd( dd, 
                Cudd_NotCond( Cudd_bddIthVar(dd, Ivy_ObjFanin0(pObj)->TravId), Ivy_ObjFaninC0(pObj) ),
                Cudd_NotCond( Cudd_bddIthVar(dd, Ivy_ObjFanin1(pObj)->TravId), Ivy_ObjFaninC1(pObj) ) );
        Cudd_Ref( pFuncs[i] );
    }
    // add the remaining vars
    assert( NewSize == dd->size );
    for ( i = Vec_PtrSize(vFront); i < dd->size; i++ )
    {
        pFuncs[i] = Cudd_bddIthVar( dd, i );
        Cudd_Ref( pFuncs[i] );
    }

    // create new
    bFuncNew = Cudd_bddVectorCompose( dd, bFunc, pFuncs ); Cudd_Ref( bFuncNew );
    // clean trav Id
    Vec_PtrForEachEntry( Ivy_Obj_t *, vTemp, pObj, i )
    {
        pObj->fMarkB = 0;
        pObj->TravId = 0;
    }
    // deref
    for ( i = 0; i < dd->size; i++ )
        Cudd_RecursiveDeref( dd, pFuncs[i] );
    ABC_FREE( pFuncs );

    ABC_FREE( vFront->pArray );
    *vFront = *vTemp;

    vTemp->nCap = vTemp->nSize = 0;
    vTemp->pArray = NULL;
    Vec_PtrFree( vTemp );

    Cudd_Deref( bFuncNew );
    return bFuncNew;
}